

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementDocument.cpp
# Opt level: O0

void __thiscall Rml::ElementDocument::~ElementDocument(ElementDocument *this)

{
  ElementDocument *this_local;
  
  ~ElementDocument(this);
  operator_delete(this,0x1e8);
  return;
}

Assistant:

ElementDocument::~ElementDocument() {}